

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1b0fcc::PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
          (PODSmallVector<(anonymous_namespace)::Node_*,_32UL> *this,Node **Elem)

{
  Node **__src;
  Node *pNVar1;
  Node **ppNVar2;
  Node **__dest;
  size_t __n;
  
  ppNVar2 = this->Last;
  if (ppNVar2 == this->Cap) {
    __src = this->First;
    __n = (long)ppNVar2 - (long)__src;
    if (__src == this->Inline) {
      __dest = (Node **)malloc(__n * 2);
      if (__dest == (Node **)0x0) goto LAB_001572c5;
      if (ppNVar2 != __src) {
        memmove(__dest,__src,__n);
      }
      this->First = __dest;
    }
    else {
      ppNVar2 = (Node **)realloc(__src,__n * 2);
      this->First = ppNVar2;
      if (ppNVar2 == (Node **)0x0) {
LAB_001572c5:
        std::terminate();
      }
    }
    this->Last = (Node **)((long)this->First + __n);
    this->Cap = this->First + ((long)__n >> 2);
  }
  pNVar1 = *Elem;
  ppNVar2 = this->Last;
  this->Last = ppNVar2 + 1;
  *ppNVar2 = pNVar1;
  return;
}

Assistant:

void push_back(const T& Elem) {
    if (Last == Cap)
      reserve(size() * 2);
    *Last++ = Elem;
  }